

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multidim_static_test.cpp
# Opt level: O2

void dumpinfo<multidim::MultiDimNView<double,multidim::type_sequence<multidim::sspair<5,336>,multidim::sspair<3,112>,multidim::sspair<2,56>,multidim::sspair<7,8>,multidim::sspair<4,2>,multidim::sspair<2,1>>>>
               (MultiDimNView<double,_multidim::type_sequence<multidim::sspair<5,_336>,_multidim::sspair<3,_112>,_multidim::sspair<2,_56>,_multidim::sspair<7,_8>,_multidim::sspair<4,_2>,_multidim::sspair<2,_1>_>_>
                *x,char *name)

{
  int iVar1;
  ostream *poVar2;
  int i;
  int iVar3;
  
  poVar2 = std::operator<<((ostream *)&std::cout,name);
  poVar2 = std::operator<<(poVar2," has ndims:");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,6);
  poVar2 = std::operator<<(poVar2," numel:");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x690);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::operator<<((ostream *)&std::cout," sizes: ");
  for (iVar3 = 0; iVar3 != 6; iVar3 = iVar3 + 1) {
    iVar1 = multidim::details::
            daccessor<0,_multidim::sspair<5,_336>,_multidim::sspair<3,_112>,_multidim::sspair<2,_56>,_multidim::sspair<7,_8>,_multidim::sspair<4,_2>,_multidim::sspair<2,_1>_>
            ::size(iVar3);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
    std::operator<<(poVar2," ");
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::operator<<((ostream *)&std::cout," steps: ");
  for (iVar3 = 0; iVar3 != 6; iVar3 = iVar3 + 1) {
    iVar1 = multidim::details::
            daccessor<0,_multidim::sspair<5,_336>,_multidim::sspair<3,_112>,_multidim::sspair<2,_56>,_multidim::sspair<7,_8>,_multidim::sspair<4,_2>,_multidim::sspair<2,_1>_>
            ::step(iVar3);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
    std::operator<<(poVar2," ");
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  return;
}

Assistant:

void dumpinfo(const T& x,const char * name)
{
	std::cout << name << " has ndims:" << x.ndims() << " numel:" << x.numel() << std::endl;
	std::cout << " sizes: ";
	for(int i = 0; i < x.ndims(); i++)
	{
		std::cout << x.getsize(i) << " ";
	}
	std::cout << std::endl;
	std::cout << " steps: ";
	for(int i = 0; i < x.ndims(); i++)
	{
		std::cout << x.getstep(i) << " ";
	}
	std::cout << std::endl;
}